

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

size_t utf8size(void *str)

{
  size_t size;
  char *s;
  void *str_local;
  
  for (size = 0; *(char *)((long)str + size) != '\0'; size = size + 1) {
  }
  return size + 1;
}

Assistant:

size_t utf8size(const void *str) {
  const char *s = (const char *)str;
  size_t size = 0;
  while ('\0' != s[size]) {
    size++;
  }

  // we are including the null terminating byte in the size calculation
  size++;
  return size;
}